

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

BrandedDecl *
kj::_::
CopyConstructArray_<capnp::compiler::NodeTranslator::BrandedDecl,_capnp::compiler::NodeTranslator::BrandedDecl_*,_false,_false>
::apply(BrandedDecl *pos,BrandedDecl *start,BrandedDecl *end)

{
  BrandedDecl *pBVar1;
  undefined1 local_30 [8];
  ExceptionGuard guard;
  BrandedDecl *end_local;
  BrandedDecl *start_local;
  BrandedDecl *pos_local;
  
  guard.pos = end;
  ExceptionGuard::ExceptionGuard((ExceptionGuard *)local_30,pos);
  end_local = start;
  while (pBVar1 = guard.start, end_local != guard.pos) {
    ctor<capnp::compiler::NodeTranslator::BrandedDecl,capnp::compiler::NodeTranslator::BrandedDecl&>
              (guard.start,end_local);
    guard.start = guard.start + 1;
    end_local = end_local + 1;
  }
  local_30 = (undefined1  [8])guard.start;
  ExceptionGuard::~ExceptionGuard((ExceptionGuard *)local_30);
  return pBVar1;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(*start);

    if (noexcept(T(*start))) {
      while (start != end) {
        ctor(*pos++, *start++);
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, *start++);
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }